

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

void variance_kernel_avx2(__m256i src,__m256i ref,__m256i *sse,__m256i *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  __m256i madd1;
  __m256i madd0;
  __m256i diff1;
  __m256i diff0;
  __m256i src_ref1;
  __m256i src_ref0;
  __m256i adj_sub;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar1 = vpinsrw_avx(ZEXT216(0xff01),0xff01,1);
  auVar1 = vpinsrw_avx(auVar1,0xff01,2);
  auVar1 = vpinsrw_avx(auVar1,0xff01,3);
  auVar1 = vpinsrw_avx(auVar1,0xff01,4);
  auVar1 = vpinsrw_avx(auVar1,0xff01,5);
  auVar1 = vpinsrw_avx(auVar1,0xff01,6);
  auVar1 = vpinsrw_avx(auVar1,0xff01,7);
  auVar2 = vpinsrw_avx(ZEXT216(0xff01),0xff01,1);
  auVar2 = vpinsrw_avx(auVar2,0xff01,2);
  auVar2 = vpinsrw_avx(auVar2,0xff01,3);
  auVar2 = vpinsrw_avx(auVar2,0xff01,4);
  auVar2 = vpinsrw_avx(auVar2,0xff01,5);
  auVar2 = vpinsrw_avx(auVar2,0xff01,6);
  auVar2 = vpinsrw_avx(auVar2,0xff01,7);
  uStack_70 = auVar2._0_8_;
  uStack_68 = auVar2._8_8_;
  auVar5._8_8_ = in_XMM0_Qb;
  auVar5._0_8_ = in_XMM0_Qa;
  auVar5._16_8_ = in_YMM0_H;
  auVar5._24_8_ = in_register_00001218;
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = in_XMM1_Qa;
  auVar6._16_8_ = in_YMM1_H;
  auVar6._24_8_ = in_register_00001258;
  auVar6 = vpunpcklbw_avx2(auVar5,auVar6);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4._16_8_ = in_YMM0_H;
  auVar4._24_8_ = in_register_00001218;
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = in_XMM1_Qa;
  auVar3._16_8_ = in_YMM1_H;
  auVar3._24_8_ = in_register_00001258;
  auVar5 = vpunpckhbw_avx2(auVar4,auVar3);
  auVar8._16_8_ = uStack_70;
  auVar8._0_16_ = auVar1;
  auVar8._24_8_ = uStack_68;
  auVar6 = vpmaddubsw_avx2(auVar6,auVar8);
  auVar7._16_8_ = uStack_70;
  auVar7._0_16_ = auVar1;
  auVar7._24_8_ = uStack_68;
  auVar5 = vpmaddubsw_avx2(auVar5,auVar7);
  auVar3 = vpmaddwd_avx2(auVar6,auVar6);
  auVar4 = vpmaddwd_avx2(auVar5,auVar5);
  auVar6 = vpaddw_avx2(auVar6,auVar5);
  auVar6 = vpaddw_avx2(*in_RSI,auVar6);
  *in_RSI = auVar6;
  auVar6 = vpaddd_avx2(auVar3,auVar4);
  auVar6 = vpaddd_avx2(*in_RDI,auVar6);
  *in_RDI = auVar6;
  return;
}

Assistant:

static inline void variance_kernel_avx2(const __m256i src, const __m256i ref,
                                        __m256i *const sse,
                                        __m256i *const sum) {
  const __m256i adj_sub = _mm256_set1_epi16((short)0xff01);  // (1,-1)

  // unpack into pairs of source and reference values
  const __m256i src_ref0 = _mm256_unpacklo_epi8(src, ref);
  const __m256i src_ref1 = _mm256_unpackhi_epi8(src, ref);

  // subtract adjacent elements using src*1 + ref*-1
  const __m256i diff0 = _mm256_maddubs_epi16(src_ref0, adj_sub);
  const __m256i diff1 = _mm256_maddubs_epi16(src_ref1, adj_sub);
  const __m256i madd0 = _mm256_madd_epi16(diff0, diff0);
  const __m256i madd1 = _mm256_madd_epi16(diff1, diff1);

  // add to the running totals
  *sum = _mm256_add_epi16(*sum, _mm256_add_epi16(diff0, diff1));
  *sse = _mm256_add_epi32(*sse, _mm256_add_epi32(madd0, madd1));
}